

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_memq_op(sexp ctx,sexp self,sexp_sint_t n,sexp x,sexp ls)

{
  bool bVar1;
  sexp ls_local;
  sexp x_local;
  sexp_sint_t n_local;
  sexp self_local;
  sexp ctx_local;
  
  ls_local = ls;
  while( true ) {
    bVar1 = false;
    if (((ulong)ls_local & 3) == 0) {
      bVar1 = ls_local->tag == 6;
    }
    if (!bVar1) break;
    if (x == (ls_local->value).type.name) {
      return ls_local;
    }
    ls_local = (ls_local->value).type.cpl;
  }
  return (sexp)&DAT_0000003e;
}

Assistant:

sexp sexp_memq_op (sexp ctx, sexp self, sexp_sint_t n, sexp x, sexp ls) {
  while (sexp_pairp(ls))
    if (x == sexp_car(ls))
      return ls;
    else
      ls = sexp_cdr(ls);
  return SEXP_FALSE;
}